

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

bool __thiscall
VmaDefragmentationContext_T::ComputeDefragmentation_Balanced
          (VmaDefragmentationContext_T *this,VmaBlockVector *vector,size_t index,bool update)

{
  size_t sVar1;
  VmaDeviceMemoryBlock *pBlock;
  VmaBlockMetadata *metadata;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  CounterStatus CVar5;
  VkResult VVar6;
  ulong uVar7;
  undefined4 extraout_var;
  ulong uVar8;
  VkDeviceSize VVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined7 in_register_00000009;
  ulong end;
  StateBalanced *state;
  ulong uVar10;
  MoveAllocationData moveData;
  VmaAllocationRequest local_68;
  VmaAllocHandle handle;
  undefined4 extraout_var_00;
  
  state = (StateBalanced *)(index * 0x10 + (long)this->m_AlgorithmState);
  if (((int)CONCAT71(in_register_00000009,update) != 0) &&
     (state->avgAllocSize == 0xffffffffffffffff)) {
    UpdateVectorStatistics(this,vector,state);
  }
  sVar1 = (this->m_Moves).m_Count;
  uVar7 = state->avgFreeSize >> 1;
  end = (vector->m_Blocks).m_Count;
  do {
    end = end - 1;
    if (end <= this->m_ImmovableBlockCount) {
      if (sVar1 == (this->m_Moves).m_Count && !update) {
        state->avgAllocSize = 0xffffffffffffffff;
        bVar3 = ComputeDefragmentation_Balanced(this,vector,index,false);
      }
      else {
        bVar3 = false;
      }
      return bVar3;
    }
    pBlock = (vector->m_Blocks).m_pArray[end];
    metadata = pBlock->m_pMetadata;
    iVar4 = (*metadata->_vptr_VmaBlockMetadata[0xb])(metadata);
    handle = (VmaAllocHandle)CONCAT44(extraout_var,iVar4);
    uVar10 = 0;
    while (handle != (VmaAllocHandle)0x0) {
      GetMoveData(&moveData,handle,metadata);
      uVar8 = uVar10;
      if (((VmaDefragmentationContext_T *)(moveData.move.srcAllocation)->m_pUserData != this) &&
         (CVar5 = CheckCounters(this,(moveData.move.srcAllocation)->m_Size), CVar5 != Ignore)) {
        if (CVar5 == End) {
          return true;
        }
        sVar2 = (this->m_Moves).m_Count;
        bVar3 = AllocInOtherBlock(this,0,end,&moveData,vector);
        if (bVar3) {
          return true;
        }
        iVar4 = (*metadata->_vptr_VmaBlockMetadata[0xd])(metadata,handle);
        uVar8 = CONCAT44(extraout_var_00,iVar4);
        VVar9 = VmaAllocation_T::GetOffset(moveData.move.srcAllocation);
        if ((((VVar9 != 0) && (sVar2 == (this->m_Moves).m_Count)) &&
            (iVar4 = (*metadata->_vptr_VmaBlockMetadata[6])(metadata),
            moveData.size <= CONCAT44(extraout_var_01,iVar4))) &&
           (((uVar7 <= uVar10 || (uVar7 <= uVar8)) ||
            ((moveData.size <= state->avgFreeSize || (moveData.size <= state->avgAllocSize)))))) {
          local_68.customData = (void *)0x0;
          local_68.algorithmData = 0;
          local_68.item.m_pList = (VmaRawList<VmaSuballocation> *)0x0;
          local_68.item.m_pItem = (VmaListItem<VmaSuballocation> *)0x0;
          local_68.type = Normal;
          local_68.allocHandle = (VmaAllocHandle)0x0;
          local_68.size = 0;
          iVar4 = (*metadata->_vptr_VmaBlockMetadata[0x11])
                            (metadata,moveData.size,moveData.alignment,0,(ulong)moveData.type,
                             0x40000,&local_68);
          if ((((char)iVar4 != '\0') &&
              (iVar4 = (*metadata->_vptr_VmaBlockMetadata[9])(metadata,local_68.allocHandle),
              CONCAT44(extraout_var_02,iVar4) < VVar9)) &&
             (VVar6 = VmaBlockVector::CommitAllocationRequest
                                (vector,&local_68,pBlock,moveData.alignment,moveData.flags,this,
                                 moveData.type,&moveData.move.dstTmpAllocation), VVar6 == VK_SUCCESS
             )) {
            VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::push_back
                      (&this->m_Moves,&moveData.move);
            bVar3 = IncrementCounters(this,moveData.size);
            if (bVar3) {
              return true;
            }
          }
        }
      }
      iVar4 = (*metadata->_vptr_VmaBlockMetadata[0xc])(metadata,handle);
      uVar10 = uVar8;
      handle = (VmaAllocHandle)CONCAT44(extraout_var_03,iVar4);
    }
  } while( true );
}

Assistant:

bool VmaDefragmentationContext_T::ComputeDefragmentation_Balanced(VmaBlockVector& vector, size_t index, bool update)
{
    // Go over every allocation and try to fit it in previous blocks at lowest offsets,
    // if not possible: realloc within single block to minimize offset (exclude offset == 0),
    // but only if there are noticable gaps between them (some heuristic, ex. average size of allocation in block)
    VMA_ASSERT(m_AlgorithmState != VMA_NULL);

    StateBalanced& vectorState = reinterpret_cast<StateBalanced*>(m_AlgorithmState)[index];
    if (update && vectorState.avgAllocSize == UINT64_MAX)
        UpdateVectorStatistics(vector, vectorState);

    const size_t startMoveCount = m_Moves.size();
    VkDeviceSize minimalFreeRegion = vectorState.avgFreeSize / 2;
    for (size_t i = vector.GetBlockCount() - 1; i > m_ImmovableBlockCount; --i)
    {
        VmaDeviceMemoryBlock* block = vector.GetBlock(i);
        VmaBlockMetadata* metadata = block->m_pMetadata;
        VkDeviceSize prevFreeRegionSize = 0;

        for (VmaAllocHandle handle = metadata->GetAllocationListBegin();
            handle != VK_NULL_HANDLE;
            handle = metadata->GetNextAllocation(handle))
        {
            MoveAllocationData moveData = GetMoveData(handle, metadata);
            // Ignore newly created allocations by defragmentation algorithm
            if (moveData.move.srcAllocation->GetUserData() == this)
                continue;
            switch (CheckCounters(moveData.move.srcAllocation->GetSize()))
            {
            case CounterStatus::Ignore:
                continue;
            case CounterStatus::End:
                return true;
            default:
                VMA_ASSERT(0);
            case CounterStatus::Pass:
                break;
            }

            // Check all previous blocks for free space
            const size_t prevMoveCount = m_Moves.size();
            if (AllocInOtherBlock(0, i, moveData, vector))
                return true;

            VkDeviceSize nextFreeRegionSize = metadata->GetNextFreeRegionSize(handle);
            // If no room found then realloc within block for lower offset
            VkDeviceSize offset = moveData.move.srcAllocation->GetOffset();
            if (prevMoveCount == m_Moves.size() && offset != 0 && metadata->GetSumFreeSize() >= moveData.size)
            {
                // Check if realloc will make sense
                if (prevFreeRegionSize >= minimalFreeRegion ||
                    nextFreeRegionSize >= minimalFreeRegion ||
                    moveData.size <= vectorState.avgFreeSize ||
                    moveData.size <= vectorState.avgAllocSize)
                {
                    VmaAllocationRequest request = {};
                    if (metadata->CreateAllocationRequest(
                        moveData.size,
                        moveData.alignment,
                        false,
                        moveData.type,
                        VMA_ALLOCATION_CREATE_STRATEGY_MIN_OFFSET_BIT,
                        &request))
                    {
                        if (metadata->GetAllocationOffset(request.allocHandle) < offset)
                        {
                            if (vector.CommitAllocationRequest(
                                request,
                                block,
                                moveData.alignment,
                                moveData.flags,
                                this,
                                moveData.type,
                                &moveData.move.dstTmpAllocation) == VK_SUCCESS)
                            {
                                m_Moves.push_back(moveData.move);
                                if (IncrementCounters(moveData.size))
                                    return true;
                            }
                        }
                    }
                }
            }
            prevFreeRegionSize = nextFreeRegionSize;
        }
    }
    
    // No moves perfomed, update statistics to current vector state
    if (startMoveCount == m_Moves.size() && !update)
    {
        vectorState.avgAllocSize = UINT64_MAX;
        return ComputeDefragmentation_Balanced(vector, index, false);
    }
    return false;
}